

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTrFunc.cpp
# Opt level: O2

NaTransFunc * __thiscall NaTransFunc::operator+=(NaTransFunc *this,NaTransFunc *tf)

{
  UnionType UVar1;
  UnionType UVar2;
  NaTransFunc *pNVar3;
  NaTransFunc *tf_tmp;
  NaTransFunc local_128;
  
  UVar1 = this->ut;
  UVar2 = tf->ut;
  if (UVar1 == utSum && UVar2 == utSum) {
    (*(this->super_NaUnit).super_NaLogging._vptr_NaLogging[0x13])(this,tf);
  }
  else if (UVar1 == utSum && UVar2 != utSum) {
    pNVar3 = (NaTransFunc *)operator_new(0x108);
    NaTransFunc(pNVar3,tf);
    local_128.super_NaUnit.super_NaLogging._vptr_NaLogging = (_func_int **)pNVar3;
    NaDynAr<NaTransFunc_*>::addh(&this->items,(NaTransFunc **)&local_128);
  }
  else if (UVar2 == utSum && UVar1 != utSum) {
    pNVar3 = (NaTransFunc *)operator_new(0x108);
    NaTransFunc(pNVar3,this);
    local_128.super_NaUnit.super_NaLogging._vptr_NaLogging = (_func_int **)pNVar3;
    operator=(this,tf);
    NaDynAr<NaTransFunc_*>::addl(&this->items,(NaTransFunc **)&local_128);
  }
  else {
    operator+(&local_128,this,tf);
    operator=(this,&local_128);
    ~NaTransFunc(&local_128);
  }
  return this;
}

Assistant:

NaTransFunc&
NaTransFunc::operator+= (const NaTransFunc& tf)
{
    if(utSum == ut && utSum == tf.ut){
        CopyItems(tf);
    }else if(utSum == ut && utSum != tf.ut){
        items.addh(new NaTransFunc(tf));
    }else if(utSum != ut && utSum == tf.ut){
        NaTransFunc *tf_tmp = new NaTransFunc(*this);
        *this = tf;
        items.addl(tf_tmp);
    }else{ //if(utSum != ut && utSum != tf.ut)
        *this = *this + tf;
    }

    return *this;
}